

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_NewCFunctionData(JSContext *ctx,JSCFunctionData *func,int length,int magic,int data_len,
                           JSValue *data)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  long lVar4;
  ulong uVar5;
  JSValue v;
  JSValue JVar6;
  
  v = JS_NewObjectProtoClass(ctx,ctx->function_proto,0xf);
  if ((v.tag & 0xffffffffU) != 6) {
    puVar3 = (undefined8 *)js_malloc(ctx,(long)data_len * 0x10 + 0x10);
    if (puVar3 == (undefined8 *)0x0) {
      JS_FreeValue(ctx,v);
      v = (JSValue)(ZEXT816(6) << 0x40);
      uVar5 = 0;
      goto LAB_00117907;
    }
    *puVar3 = func;
    *(char *)(puVar3 + 1) = (char)length;
    *(char *)((long)puVar3 + 9) = (char)data_len;
    *(short *)((long)puVar3 + 10) = (short)magic;
    lVar4 = 0;
    if (data_len < 1) {
      data_len = 0;
    }
    for (; (ulong)(uint)data_len * 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
      piVar1 = *(int **)((long)&data->u + lVar4);
      uVar2 = *(undefined8 *)((long)&data->tag + lVar4);
      if (0xfffffff4 < (uint)uVar2) {
        *piVar1 = *piVar1 + 1;
      }
      *(int **)((long)puVar3 + lVar4 + 0x10) = piVar1;
      *(undefined8 *)((long)puVar3 + lVar4 + 0x18) = uVar2;
    }
    if ((int)v.tag == -1) {
      *(undefined8 **)((long)v.u.ptr + 0x30) = puVar3;
    }
    js_function_set_properties(ctx,v,0x2f,length);
  }
  uVar5 = (ulong)v.u.ptr & 0xffffffff00000000;
LAB_00117907:
  JVar6.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar5);
  JVar6.tag = v.tag;
  return JVar6;
}

Assistant:

JSValue JS_NewCFunctionData(JSContext *ctx, JSCFunctionData *func,
                            int length, int magic, int data_len,
                            JSValueConst *data)
{
    JSCFunctionDataRecord *s;
    JSValue func_obj;
    int i;

    func_obj = JS_NewObjectProtoClass(ctx, ctx->function_proto,
                                      JS_CLASS_C_FUNCTION_DATA);
    if (JS_IsException(func_obj))
        return func_obj;
    s = js_malloc(ctx, sizeof(*s) + data_len * sizeof(JSValue));
    if (!s) {
        JS_FreeValue(ctx, func_obj);
        return JS_EXCEPTION;
    }
    s->func = func;
    s->length = length;
    s->data_len = data_len;
    s->magic = magic;
    for(i = 0; i < data_len; i++)
        s->data[i] = JS_DupValue(ctx, data[i]);
    JS_SetOpaque(func_obj, s);
    js_function_set_properties(ctx, func_obj,
                               JS_ATOM_empty_string, length);
    return func_obj;
}